

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void cfgfile::generator::generate_cfg_set(ostream *stream,const_class_ptr_t c)

{
  bool bVar1;
  field_type_t fVar2;
  ostream *poVar3;
  string *psVar4;
  class_t *in_RSI;
  ostream *in_RDI;
  field_t *f;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
  *__range2;
  vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
  *in_stack_fffffffffffff738;
  __normal_iterator<const_cfgfile::generator::cfg::field_t_*,_std::vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>_>
  *in_stack_fffffffffffff740;
  vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
  *in_stack_fffffffffffff750;
  ostream *in_stack_fffffffffffff768;
  ostream *in_stack_fffffffffffff7a8;
  allocator local_599;
  string local_598 [39];
  allocator local_571;
  string local_570 [39];
  allocator local_549;
  string local_548 [39];
  allocator local_521;
  string local_520 [39];
  allocator local_4f9;
  string local_4f8 [39];
  allocator local_4d1;
  string local_4d0 [39];
  allocator local_4a9;
  string local_4a8 [39];
  allocator local_481;
  string local_480 [39];
  allocator local_459;
  string local_458 [39];
  allocator local_431;
  string local_430 [39];
  allocator local_409;
  string local_408 [39];
  allocator local_3e1;
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [32];
  string local_370 [39];
  allocator local_349;
  string local_348 [39];
  allocator local_321;
  string local_320 [32];
  string local_300 [39];
  allocator local_2d9;
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [32];
  string local_290 [39];
  allocator local_269;
  string local_268 [39];
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [39];
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  field_t *local_30;
  field_t *local_28;
  __normal_iterator<const_cfgfile::generator::cfg::field_t_*,_std::vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>_>
  local_20;
  vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
  *local_18;
  class_t *local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = cfg::class_t::fields(in_RSI);
  local_20._M_current =
       (field_t *)
       std::
       vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>::
       begin(in_stack_fffffffffffff738);
  local_28 = (field_t *)
             std::
             vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
             ::end(in_stack_fffffffffffff738);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_fffffffffffff740,
                            (__normal_iterator<const_cfgfile::generator::cfg::field_t_*,_std::vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>_>
                             *)in_stack_fffffffffffff738), bVar1) {
    local_30 = __gnu_cxx::
               __normal_iterator<const_cfgfile::generator::cfg::field_t_*,_std::vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>_>
               ::operator*(&local_20);
    bVar1 = cfg::field_t::is_base(local_30);
    if (bVar1) {
      fVar2 = cfg::field_t::type(local_30);
      poVar3 = local_8;
      if (fVar2 == scalar_field_type) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_4d0,"\t\tthis->set_value( cfg.",&local_4d1);
        in_stack_fffffffffffff7a8 = std::operator<<(poVar3,local_4d0);
        psVar4 = cfg::field_t::name_abi_cxx11_(local_30);
        poVar3 = std::operator<<(in_stack_fffffffffffff7a8,(string *)psVar4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_4f8,"() );\n",&local_4f9);
        std::operator<<(poVar3,local_4f8);
        std::__cxx11::string::~string(local_4f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
        std::__cxx11::string::~string(local_4d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
      }
      else if (fVar2 == scalar_vector_field_type) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_520,"\t\tthis->set_values( cfg.",&local_521);
        poVar3 = std::operator<<(poVar3,local_520);
        psVar4 = cfg::field_t::name_abi_cxx11_(local_30);
        in_stack_fffffffffffff768 = std::operator<<(poVar3,(string *)psVar4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_548,"() );\n",&local_549);
        std::operator<<(in_stack_fffffffffffff768,local_548);
        std::__cxx11::string::~string(local_548);
        std::allocator<char>::~allocator((allocator<char> *)&local_549);
        std::__cxx11::string::~string(local_520);
        std::allocator<char>::~allocator((allocator<char> *)&local_521);
      }
    }
    else {
      fVar2 = cfg::field_t::type(local_30);
      poVar3 = local_8;
      switch(fVar2) {
      case scalar_field_type:
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d8,"\t\tm_",&local_d9);
        poVar3 = std::operator<<(poVar3,local_d8);
        psVar4 = cfg::field_t::name_abi_cxx11_(local_30);
        poVar3 = std::operator<<(poVar3,(string *)psVar4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_100,".set_value( cfg.",&local_101);
        poVar3 = std::operator<<(poVar3,local_100);
        psVar4 = cfg::field_t::name_abi_cxx11_(local_30);
        poVar3 = std::operator<<(poVar3,(string *)psVar4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_128,"() );\n",&local_129);
        std::operator<<(poVar3,local_128);
        std::__cxx11::string::~string(local_128);
        std::allocator<char>::~allocator((allocator<char> *)&local_129);
        std::__cxx11::string::~string(local_100);
        std::allocator<char>::~allocator((allocator<char> *)&local_101);
        std::__cxx11::string::~string(local_d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_d9);
        break;
      case no_value_field_type:
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_50,"\n\t\tif( cfg.",&local_51);
        poVar3 = std::operator<<(poVar3,local_50);
        psVar4 = cfg::field_t::name_abi_cxx11_(local_30);
        poVar3 = std::operator<<(poVar3,(string *)psVar4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_88,"() )\n\t\t\tm_",&local_89);
        poVar3 = std::operator<<(poVar3,local_88);
        psVar4 = cfg::field_t::name_abi_cxx11_(local_30);
        poVar3 = std::operator<<(poVar3,(string *)psVar4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b0,".set_defined();\n\n",&local_b1);
        std::operator<<(poVar3,local_b0);
        std::__cxx11::string::~string(local_b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_b1);
        std::__cxx11::string::~string(local_88);
        std::allocator<char>::~allocator((allocator<char> *)&local_89);
        std::__cxx11::string::~string(local_50);
        std::allocator<char>::~allocator((allocator<char> *)&local_51);
        break;
      case scalar_vector_field_type:
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_150,"\t\tm_",&local_151);
        poVar3 = std::operator<<(poVar3,local_150);
        psVar4 = cfg::field_t::name_abi_cxx11_(local_30);
        poVar3 = std::operator<<(poVar3,(string *)psVar4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_178,".set_values( cfg.",&local_179);
        poVar3 = std::operator<<(poVar3,local_178);
        psVar4 = cfg::field_t::name_abi_cxx11_(local_30);
        poVar3 = std::operator<<(poVar3,(string *)psVar4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1a0,"() );\n",&local_1a1);
        std::operator<<(poVar3,local_1a0);
        std::__cxx11::string::~string(local_1a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
        std::__cxx11::string::~string(local_178);
        std::allocator<char>::~allocator((allocator<char> *)&local_179);
        std::__cxx11::string::~string(local_150);
        std::allocator<char>::~allocator((allocator<char> *)&local_151);
        break;
      case vector_of_tags_field_type:
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1c8,"\n\t\tfor( const ",&local_1c9);
        poVar3 = std::operator<<(poVar3,local_1c8);
        psVar4 = cfg::field_t::value_type_abi_cxx11_(local_30);
        poVar3 = std::operator<<(poVar3,(string *)psVar4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1f0," & v : cfg.",&local_1f1);
        poVar3 = std::operator<<(poVar3,local_1f0);
        psVar4 = cfg::field_t::name_abi_cxx11_(local_30);
        poVar3 = std::operator<<(poVar3,(string *)psVar4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_218,"() )\n",&local_219);
        poVar3 = std::operator<<(poVar3,local_218);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_240,"\t\t{\n",&local_241);
        poVar3 = std::operator<<(poVar3,local_240);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_268,"\t\t\ttypename cfgfile::tag_vector_of_tags_t< ",&local_269);
        poVar3 = std::operator<<(poVar3,local_268);
        cfg::field_t::value_type_abi_cxx11_(local_30);
        generate_class_name((string *)in_stack_fffffffffffff7a8);
        poVar3 = std::operator<<(poVar3,local_290);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2b0,"< Trait >, Trait >::ptr_to_tag_t p(\n",&local_2b1);
        poVar3 = std::operator<<(poVar3,local_2b0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2d8,"\t\t\t\tnew ",&local_2d9);
        poVar3 = std::operator<<(poVar3,local_2d8);
        cfg::field_t::value_type_abi_cxx11_(local_30);
        generate_class_name((string *)in_stack_fffffffffffff7a8);
        poVar3 = std::operator<<(poVar3,local_300);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_320,"< Trait >( \"",&local_321);
        poVar3 = std::operator<<(poVar3,local_320);
        psVar4 = cfg::field_t::name_abi_cxx11_(local_30);
        poVar3 = std::operator<<(poVar3,(string *)psVar4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_348,"\", ",&local_349);
        poVar3 = std::operator<<(poVar3,local_348);
        cfg::field_t::is_required(local_30);
        bool_to_string_abi_cxx11_(SUB81((ulong)in_stack_fffffffffffff768 >> 0x38,0));
        poVar3 = std::operator<<(poVar3,local_370);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_390," ) );\n\n",&local_391);
        poVar3 = std::operator<<(poVar3,local_390);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3b8,"\t\t\tp->set_cfg( v );\n\n",&local_3b9);
        poVar3 = std::operator<<(poVar3,local_3b8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3e0,"\t\t\tm_",&local_3e1);
        poVar3 = std::operator<<(poVar3,local_3e0);
        psVar4 = cfg::field_t::name_abi_cxx11_(local_30);
        poVar3 = std::operator<<(poVar3,(string *)psVar4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_408,".set_value( p );\n",&local_409);
        poVar3 = std::operator<<(poVar3,local_408);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_430,"\t\t}\n",&local_431);
        std::operator<<(poVar3,local_430);
        std::__cxx11::string::~string(local_430);
        std::allocator<char>::~allocator((allocator<char> *)&local_431);
        std::__cxx11::string::~string(local_408);
        std::allocator<char>::~allocator((allocator<char> *)&local_409);
        std::__cxx11::string::~string(local_3e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
        std::__cxx11::string::~string(local_3b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
        std::__cxx11::string::~string(local_390);
        std::allocator<char>::~allocator((allocator<char> *)&local_391);
        std::__cxx11::string::~string(local_370);
        std::__cxx11::string::~string(local_348);
        std::allocator<char>::~allocator((allocator<char> *)&local_349);
        std::__cxx11::string::~string(local_320);
        std::allocator<char>::~allocator((allocator<char> *)&local_321);
        std::__cxx11::string::~string(local_300);
        std::__cxx11::string::~string(local_2d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
        std::__cxx11::string::~string(local_2b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
        std::__cxx11::string::~string(local_290);
        std::__cxx11::string::~string(local_268);
        std::allocator<char>::~allocator((allocator<char> *)&local_269);
        std::__cxx11::string::~string(local_240);
        std::allocator<char>::~allocator((allocator<char> *)&local_241);
        std::__cxx11::string::~string(local_218);
        std::allocator<char>::~allocator((allocator<char> *)&local_219);
        std::__cxx11::string::~string(local_1f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
        std::__cxx11::string::~string(local_1c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
        break;
      case custom_tag_field_type:
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_458,"\t\tm_",&local_459);
        poVar3 = std::operator<<(poVar3,local_458);
        psVar4 = cfg::field_t::name_abi_cxx11_(local_30);
        poVar3 = std::operator<<(poVar3,(string *)psVar4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_480,".set_cfg( cfg.",&local_481);
        poVar3 = std::operator<<(poVar3,local_480);
        psVar4 = cfg::field_t::name_abi_cxx11_(local_30);
        poVar3 = std::operator<<(poVar3,(string *)psVar4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_4a8,"() );\n",&local_4a9);
        std::operator<<(poVar3,local_4a8);
        std::__cxx11::string::~string(local_4a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
        std::__cxx11::string::~string(local_480);
        std::allocator<char>::~allocator((allocator<char> *)&local_481);
        std::__cxx11::string::~string(local_458);
        std::allocator<char>::~allocator((allocator<char> *)&local_459);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_cfgfile::generator::cfg::field_t_*,_std::vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>_>
    ::operator++(&local_20);
  }
  cfg::class_t::fields(local_10);
  bVar1 = std::
          vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
          ::empty(in_stack_fffffffffffff750);
  if (bVar1) {
    poVar3 = local_8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_570,"\t\t(void) cfg;",&local_571);
    std::operator<<(poVar3,local_570);
    std::__cxx11::string::~string(local_570);
    std::allocator<char>::~allocator((allocator<char> *)&local_571);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_598,"\n\t\tthis->set_defined();\n",&local_599);
  std::operator<<(local_8,local_598);
  std::__cxx11::string::~string(local_598);
  std::allocator<char>::~allocator((allocator<char> *)&local_599);
  return;
}

Assistant:

static inline void generate_cfg_set( std::ostream & stream,
	cfg::const_class_ptr_t c )
{
	for( const cfg::field_t & f : c->fields() )
	{
		if( !f.is_base() )
		{
			switch( f.type() )
			{
				case cfg::field_t::no_value_field_type :
				{
					stream << std::string( "\n\t\tif( cfg." )
						<< f.name() << std::string( "() )\n"
													  "\t\t\tm_" )
						<< f.name() << std::string( ".set_defined();\n\n" );
				}
					break;

				case cfg::field_t::scalar_field_type :
				{
					stream << std::string( "\t\tm_" )
						<< f.name()
						<< std::string( ".set_value( cfg." )
						<< f.name() << std::string( "() );\n" );
				}
					break;

				case cfg::field_t::scalar_vector_field_type :
				{
					stream << std::string( "\t\tm_" )
						<< f.name() << std::string( ".set_values( cfg." )
						<< f.name() << std::string( "() );\n" );
				}
					break;

				case cfg::field_t::vector_of_tags_field_type :
				{
					stream << std::string( "\n\t\tfor( const " )
						<< f.value_type() << std::string( " & v : cfg." )
						<< f.name() << std::string( "() )\n" )
						<< std::string( "\t\t{\n" )
						<< std::string( "\t\t\ttypename cfgfile::tag_vector_of_tags_t< " )
						<< generate_class_name( f.value_type() )
						<< std::string( "< Trait >, Trait >::ptr_to_tag_t p(\n" )
						<< std::string( "\t\t\t\tnew " )
						<< generate_class_name( f.value_type() )
						<< std::string( "< Trait >( \"" )
						<< f.name() << std::string( "\", " )
						<< bool_to_string( f.is_required() )
						<< std::string( " ) );\n\n" )
						<< std::string( "\t\t\tp->set_cfg( v );\n\n" )
						<< std::string( "\t\t\tm_" ) << f.name()
						<< std::string( ".set_value( p );\n" )
						<< std::string( "\t\t}\n" );
				}
					break;

				case cfg::field_t::custom_tag_field_type :
				{
					stream << std::string( "\t\tm_" )
						<< f.name()
						<< std::string( ".set_cfg( cfg." )
						<< f.name() << std::string( "() );\n" );
				}
					break;

				default :
					break;
			}
		}
		else
		{
			switch( f.type() )
			{
				case cfg::field_t::scalar_field_type :
				{
					stream << std::string( "\t\tthis->set_value( cfg." )
						<< f.name() << std::string( "() );\n" );
				}
					break;

				case cfg::field_t::scalar_vector_field_type :
				{
					stream << std::string( "\t\tthis->set_values( cfg." )
						<< f.name() << std::string( "() );\n" );
				}
					break;

				default :
					break;
			}
		}
	}

	if( c->fields().empty() )
		stream << std::string( "\t\t(void) cfg;" );

	stream << std::string( "\n\t\tthis->set_defined();\n" );
}